

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O1

StringRep * __thiscall
google::protobuf::internal::MicroString::AllocateStringRep(MicroString *this,Arena *arena)

{
  LargeRepKind LVar1;
  StringRep *pSVar2;
  Nonnull<const_char_*> pcVar3;
  
  if (arena == (Arena *)0x0) {
    pSVar2 = (StringRep *)operator_new(0x30);
    (pSVar2->super_LargeRep).payload = (char *)0x0;
    (pSVar2->super_LargeRep).size = 0;
    (pSVar2->super_LargeRep).capacity = 0;
    (pSVar2->str)._M_dataplus._M_p = (pointer)0x0;
    (pSVar2->str)._M_string_length = 0;
    (pSVar2->str).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar2->str).field_2 + 8) = 0;
  }
  else {
    pSVar2 = (StringRep *)
             Arena::AllocateAlignedWithCleanup
                       (arena,0x30,8,
                        cleanup::
                        arena_destruct_object<google::protobuf::internal::MicroString::StringRep>);
    (pSVar2->super_LargeRep).payload = (char *)0x0;
    (pSVar2->super_LargeRep).size = 0;
    (pSVar2->super_LargeRep).capacity = 0;
    (pSVar2->str)._M_dataplus._M_p = (pointer)0x0;
    (pSVar2->str)._M_string_length = 0;
    (pSVar2->str).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar2->str).field_2 + 8) = 0;
  }
  (pSVar2->str)._M_dataplus._M_p = (pointer)&(pSVar2->str).field_2;
  (pSVar2->str)._M_string_length = 0;
  (pSVar2->str).field_2._M_local_buf[0] = '\0';
  (pSVar2->super_LargeRep).capacity = 2;
  this->rep_ = (void *)((ulong)pSVar2 | 1);
  LVar1 = large_rep_kind(this);
  if (LVar1 == kString) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)LVar1,2,"+large_rep_kind() == +kString");
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    return pSVar2;
  }
  AllocateStringRep();
}

Assistant:

MicroString::StringRep* MicroString::AllocateStringRep(Arena* arena) {
  StringRep* h = Arena::Create<StringRep>(arena);
  h->capacity = kString;
  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) | kIsLargeRepTag);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kString);
  return h;
}